

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextobject.cpp
# Opt level: O1

iterator * __thiscall QTextFrame::iterator::operator--(iterator *this)

{
  BlockMap *this_00;
  FragmentMap *this_01;
  uint *puVar1;
  char16_t cVar2;
  QTextDocumentPrivate *this_02;
  Header *pHVar3;
  QArrayData *pQVar4;
  char16_t *pcVar5;
  bool bVar6;
  bool bVar7;
  uint p;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  QTextFrame *pQVar12;
  uint uVar13;
  
  this_02 = *(QTextDocumentPrivate **)
             (*(long *)(*(long *)&(this->f->super_QTextObject).field_0x8 + 0x10) + 8);
  this_00 = &this_02->blocks;
  if (this->cf != (QTextFrame *)0x0) {
    iVar8 = firstPosition(this->cf);
    uVar9 = QFragmentMapData<QTextBlockData>::findNode(&this_00->data,iVar8 + -1,0);
    this->cb = uVar9;
    this->cf = (QTextFrame *)0x0;
    return this;
  }
  uVar13 = this->cb;
  uVar10 = (ulong)uVar13;
  if (uVar13 == this->b) {
    return this;
  }
  if (uVar13 == this->e) goto LAB_00535382;
  pHVar3 = (this_00->data).field_0.head;
  iVar8 = *(int *)((long)pHVar3 + uVar10 * 0x48 + 0x10);
  uVar13 = *(uint *)((long)pHVar3 + uVar10 * 0x48);
  while (uVar13 != 0) {
    uVar11 = (ulong)uVar13;
    puVar1 = (uint *)((long)pHVar3 + (ulong)uVar13 * 0x48);
    if (puVar1[2] == (uint)uVar10) {
      iVar8 = iVar8 + puVar1[4] + puVar1[7];
    }
    uVar10 = uVar11;
    uVar13 = *puVar1;
  }
  this_01 = &this_02->fragments;
  uVar9 = QFragmentMapData<QTextFragmentData>::findNode(&this_01->data,iVar8 + -1,0);
  pQVar4 = &((this_02->text).d.d)->super_QArrayData;
  pcVar5 = (this_02->text).d.ptr;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  cVar2 = pcVar5[(this_01->data).field_0.fragments[uVar9].stringPosition];
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,2,0x10);
    }
  }
  if (cVar2 == L'\x2029') {
LAB_0053537c:
    bVar7 = false;
  }
  else {
    QTextDocumentPrivate::objectForFormat
              (this_02,(this_02->fragments).data.field_0.fragments[uVar9].format);
    pQVar12 = (QTextFrame *)QMetaObject::cast((QObject *)&QTextFrame::staticMetaObject);
    bVar7 = false;
    bVar6 = true;
    if (pQVar12 != (QTextFrame *)0x0) {
      pQVar4 = &((this_02->text).d.d)->super_QArrayData;
      pcVar5 = (this_02->text).d.ptr;
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      cVar2 = pcVar5[(this_01->data).field_0.fragments[uVar9].stringPosition];
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar4,2,0x10);
        }
      }
      bVar6 = true;
      if (cVar2 != L'﷐') {
        pQVar4 = &((this_02->text).d.d)->super_QArrayData;
        pcVar5 = (this_02->text).d.ptr;
        if (pQVar4 != (QArrayData *)0x0) {
          LOCK();
          (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        cVar2 = pcVar5[(this_01->data).field_0.fragments[uVar9].stringPosition];
        if (pQVar4 != (QArrayData *)0x0) {
          LOCK();
          (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar4,2,0x10);
          }
        }
        bVar6 = true;
        if (cVar2 == L'﷑') {
          this->cf = pQVar12;
          this->cb = 0;
          bVar7 = true;
          bVar6 = false;
        }
      }
    }
    if (bVar6) goto LAB_0053537c;
  }
  if (bVar7) {
    return this;
  }
LAB_00535382:
  uVar9 = QFragmentMapData<QTextBlockData>::previous(&this_00->data,this->cb);
  this->cb = uVar9;
  return this;
}

Assistant:

QTextFrame::iterator &QTextFrame::iterator::operator--()
{
    const QTextDocumentPrivate *priv = QTextDocumentPrivate::get(f);
    const QTextDocumentPrivate::BlockMap &map = priv->blockMap();
    if (cf) {
        int start = cf->firstPosition() - 1;
        cb = map.findNode(start);
        cf = nullptr;
    } else {
        if (cb == b)
            goto end;
        if (cb != e) {
            int pos = map.position(cb);
            // check if we have to enter a frame
            QTextDocumentPrivate::FragmentIterator frag = priv->find(pos-1);
            if (priv->buffer().at(frag->stringPosition) != QChar::ParagraphSeparator) {
                QTextFrame *pf = qobject_cast<QTextFrame *>(priv->objectForFormat(frag->format));
                if (pf) {
                    if (priv->buffer().at(frag->stringPosition) == QTextBeginningOfFrame) {
                        Q_ASSERT(pf == f);
                    } else if (priv->buffer().at(frag->stringPosition) == QTextEndOfFrame) {
                        Q_ASSERT(pf != f);
                        cf = pf;
                        cb = 0;
                        goto end;
                    }
                }
            }
        }
        cb = map.previous(cb);
    }
 end:
    return *this;
}